

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase_tests.cpp
# Opt level: O3

bool netbase_tests::TestParse(string *src,string *canon)

{
  size_t __n;
  DNSLookupFn dns_lookup_function;
  int iVar1;
  long in_FS_OFFSET;
  bool bVar2;
  _Any_data in_stack_ffffffffffffff78;
  _Manager_type in_stack_ffffffffffffff88;
  _Invoker_type in_stack_ffffffffffffff90;
  string local_68;
  direct_or_indirect local_48;
  uint local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  ::function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
              *)&stack0xffffffffffffff78,&g_dns_lookup_abi_cxx11_);
  dns_lookup_function.super__Function_base._M_manager = in_stack_ffffffffffffff88;
  dns_lookup_function.super__Function_base._M_functor = in_stack_ffffffffffffff78;
  dns_lookup_function._M_invoker = in_stack_ffffffffffffff90;
  LookupNumeric((CService *)&local_48.indirect_contents,src,0xffff,dns_lookup_function);
  if (in_stack_ffffffffffffff88 != (_Manager_type)0x0) {
    (*in_stack_ffffffffffffff88)
              ((_Any_data *)&stack0xffffffffffffff78,(_Any_data *)&stack0xffffffffffffff78,
               __destroy_functor);
  }
  CService::ToStringAddrPort_abi_cxx11_(&local_68,(CService *)&local_48.indirect_contents);
  __n = canon->_M_string_length;
  if (__n == local_68._M_string_length) {
    if (__n == 0) {
      bVar2 = true;
    }
    else {
      iVar1 = bcmp((canon->_M_dataplus)._M_p,local_68._M_dataplus._M_p,__n);
      bVar2 = iVar1 == 0;
    }
  }
  else {
    bVar2 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (0x10 < local_38) {
    free(local_48.indirect_contents.indirect);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool static TestParse(std::string src, std::string canon)
{
    CService addr(LookupNumeric(src, 65535));
    return canon == addr.ToStringAddrPort();
}